

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_link_errors
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  ShaderProgram *pSVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  LayoutBindingProgram *this_00;
  String local_330;
  allocator<char> local_30a;
  allocator<char> local_309;
  String local_308;
  String local_2e8;
  String local_2c8;
  long *local_2a8 [2];
  long local_298 [2];
  String local_288;
  String local_268;
  String local_248;
  String local_228;
  String decl;
  String local_1e8;
  String local_1c8;
  StringStream s;
  undefined4 extraout_var_03;
  
  if ((this->m_stage).type == VertexShader) {
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,*(char **)CONCAT44(extraout_var,iVar4),(allocator<char> *)&local_1c8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])(&local_330,this,1);
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,*(char **)(CONCAT44(extraout_var_00,iVar4) + 0x18),
               (allocator<char> *)&local_1e8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_288,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_228,this,&local_288);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_2a8,this,0);
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"float","");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_248,this,local_2a8,&local_2c8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_268,this,0);
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_local_buf[0] = '\0';
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    buildUniformDecl(&decl,this,(String *)&s,&local_330,&local_308,&local_228,&local_248,&local_268,
                     &local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                               local_2e8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8[0] != local_298) {
      operator_delete(local_2a8[0],local_298[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_330.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != paVar1) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    puVar2 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)puVar2) {
      operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      CONCAT71(s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                               s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
    }
    setTemplateParam(this,VertexShader,"UNIFORM_DECL",&decl);
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)puVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&s,"fragColor =","");
    setTemplateParam(this,VertexShader,"OUT_ASSIGNMENT",(String *)&s);
    if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)puVar2) {
      operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      CONCAT71(s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                               s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
    }
    std::ios_base::ios_base
              ((ios_base *)
               &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70)
    ;
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
         glUniformMatrix3x2fv;
    s.super_ostringstream._328_8_ = 0;
    s.super_ostringstream._336_2_ = 0;
    s.super_ostringstream._344_8_ = 0;
    s.super_ostringstream._352_8_ = 0;
    s.super_ostringstream._360_8_ = 0;
    s.super_ostringstream._368_8_ = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)&PTR__StringStream_020fda68;
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
         &PTR__StringStream_020fda90;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_308,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
              (&local_330,this,&local_308);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&s,local_330._M_dataplus._M_p,local_330._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != paVar1) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    setTemplateParam(this,VertexShader,"UNIFORM_ACCESS",&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != paVar1) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    updateTemplate(this,VertexShader);
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,*(char **)CONCAT44(extraout_var_01,iVar4),&local_309);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])(&local_228,this,3);
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,*(char **)(CONCAT44(extraout_var_02,iVar4) + 0x18),&local_30a);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_2a8,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_248,this,local_2a8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_268,this,0);
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"float","");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_2c8,this,&local_268,&local_2e8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_1c8,this,0);
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    buildUniformDecl(&local_330,this,&local_308,&local_228,&local_288,&local_248,&local_2c8,
                     &local_1c8,&local_1e8);
    std::__cxx11::string::operator=((string *)&decl,(string *)&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                               local_1e8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                               local_2e8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8[0] != local_298) {
      operator_delete(local_2a8[0],local_298[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_330.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    setTemplateParam(this,FragmentShader,"UNIFORM_DECL",&decl);
    StringStream::reset(&s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"fragColor + ",0xc);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_308,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
              (&local_330,this,&local_308);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&s,local_330._M_dataplus._M_p,local_330._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != paVar1) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    setTemplateParam(this,FragmentShader,"UNIFORM_ACCESS",&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != paVar1) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    updateTemplate(this,FragmentShader);
    iVar4 = (*(this->super_IProgramContextSupplier)._vptr_IProgramContextSupplier[6])
                      (&this->super_IProgramContextSupplier);
    this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_03,iVar4);
    iVar4 = (*this_00->_vptr_LayoutBindingProgram[2])(this_00);
    pSVar3 = this_00->m_program;
    if (iVar4 == 2) {
      if (((*pSVar3->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == true) {
LAB_00bd38dd:
        if ((pSVar3->m_program).m_info.linkOk == true) {
          LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_330,this_00,true);
          __return_storage_ptr__->m_passed = false;
          __return_storage_ptr__->m_notRunForThisContext = false;
          (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_reason).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_reason,local_330._M_dataplus._M_p,
                     local_330._M_dataplus._M_p + local_330._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != paVar1) {
            operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
          }
          (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
          std::ios_base::~ios_base
                    ((ios_base *)
                     &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      field_0x70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)decl._M_dataplus._M_p == &decl.field_2) {
            return __return_storage_ptr__;
          }
          goto LAB_00bd3a17;
        }
      }
    }
    else if (((*pSVar3->m_shaders[1].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start)->m_info).compileOk != false) goto LAB_00bd38dd;
    (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    std::ios_base::~ios_base
              ((ios_base *)
               &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl._M_dataplus._M_p != &decl.field_2) {
      operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
    }
  }
  puVar2 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
  __return_storage_ptr__->m_passed = true;
  __return_storage_ptr__->m_notRunForThisContext = false;
  (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_reason).field_2;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)puVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_reason,puVar2,puVar2);
  if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
      == (_func_int **)puVar2) {
    return __return_storage_ptr__;
  }
  decl.field_2._M_allocated_capacity =
       CONCAT71(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_);
  decl._M_dataplus._M_p =
       (pointer)s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                _vptr_basic_ostream;
LAB_00bd3a17:
  operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_link_errors(void)
{
	bool passed = true;

	// same sampler with different binding in two compilation units
	if (isStage(VertexShader))
	{
		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(1),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam(VertexShader, "UNIFORM_DECL", decl);

		setTemplateParam(VertexShader, "OUT_ASSIGNMENT", String("fragColor ="));

		StringStream s;
		s << buildAccess(getDefaultUniformName()) << ";\n";
		setTemplateParam(VertexShader, "UNIFORM_ACCESS", s.str());
		updateTemplate(VertexShader);

		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(3),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam(FragmentShader, "UNIFORM_DECL", decl);

		s.reset();
		s << "fragColor + " << buildAccess(getDefaultUniformName()) << ";\n";
		setTemplateParam(FragmentShader, "UNIFORM_ACCESS", s.str());
		updateTemplate(FragmentShader);

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed = !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}

	return LayoutBindingTestResult(passed, String());
}